

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O0

void __thiscall amrex::MLCellLinOp::defineBC(MLCellLinOp *this)

{
  pointer pMVar1;
  type pBVar2;
  int *piVar3;
  BoxArray *__args;
  long *in_RDI;
  int mglev;
  int amrlev_4;
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  bclohi;
  MultiFab bc_data;
  int amrlev_3;
  BoxArray cba_1;
  int crse_ratio_1;
  int extent_rad_1;
  int out_rad_1;
  int in_rad_1;
  int amrlev_2;
  BoxArray cba;
  int crse_ratio;
  int extent_rad;
  int out_rad;
  int in_rad;
  int amrlev_1;
  int amrlev;
  int ncomp;
  BoxArray *in_stack_fffffffffffffb88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *val;
  int in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb94;
  Real in_stack_fffffffffffffb98;
  BCRec *this_00;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffba4;
  BoxArray *in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbb0;
  int in_stack_fffffffffffffbb4;
  int *in_stack_fffffffffffffbb8;
  pointer in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc8;
  int in_stack_fffffffffffffbcc;
  MultiFab *in_stack_fffffffffffffbd0;
  BoxArray *in_stack_fffffffffffffbd8;
  FabFactory<amrex::FArrayBox> *in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf4;
  BATType BVar5;
  int local_360;
  int local_35c;
  FabFactory<amrex::FArrayBox> local_33d [4];
  BCRec local_318;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_300;
  element_type *local_2f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2f0;
  element_type *local_2e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2e0;
  pointer local_2d8;
  undefined1 local_2c8 [24];
  RealVect *in_stack_fffffffffffffd50;
  int in_stack_fffffffffffffd5c;
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  *in_stack_fffffffffffffd60;
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  *in_stack_fffffffffffffd68;
  MLMGBndry *in_stack_fffffffffffffd70;
  int local_13c;
  int local_b4;
  int local_1c;
  int local_10;
  BATType local_c;
  
  local_c = (**(code **)(*in_RDI + 0x28))();
  std::
  vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
  ::resize((vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
            *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
           (size_type)in_stack_fffffffffffffba8);
  std::
  vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
  ::resize((vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
            *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
           (size_type)in_stack_fffffffffffffba8);
  std::
  vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
  ::resize((vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
            *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
           (size_type)in_stack_fffffffffffffba8);
  std::
  vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
  ::resize((vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
            *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
           (size_type)in_stack_fffffffffffffba8);
  std::
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::resize((vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
            *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
           (size_type)in_stack_fffffffffffffba8);
  for (local_10 = 0; local_10 < *(int *)((long)in_RDI + 0x34); local_10 = local_10 + 1) {
    Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                 (size_type)in_stack_fffffffffffffb88);
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               (size_type)in_stack_fffffffffffffb88);
    Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                 (size_type)in_stack_fffffffffffffb88);
    Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               (size_type)in_stack_fffffffffffffb88);
    Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                 (size_type)in_stack_fffffffffffffb88);
    Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               (size_type)in_stack_fffffffffffffb88);
    std::
    make_unique<amrex::MLMGBndry,amrex::BoxArray&,amrex::DistributionMapping&,int_const&,amrex::Geometry&>
              ((BoxArray *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
               (DistributionMapping *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
               (Geometry *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
    Vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                 (size_type)in_stack_fffffffffffffb88);
    std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>::operator=
              ((unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_> *)
               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               (unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_> *)
               in_stack_fffffffffffffb88);
    std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>::~unique_ptr
              ((unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_> *)
               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
  }
  for (local_1c = 1; local_1c < *(int *)((long)in_RDI + 0x34); local_1c = local_1c + 1) {
    Vector<int,_std::allocator<int>_>::operator[]
              ((Vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               (size_type)in_stack_fffffffffffffb88);
    Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                 (size_type)in_stack_fffffffffffffb88);
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               (size_type)in_stack_fffffffffffffb88);
    BoxArray::BoxArray((BoxArray *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                       in_stack_fffffffffffffb88);
    BoxArray::coarsen((BoxArray *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                      (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
    Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                 (size_type)in_stack_fffffffffffffb88);
    Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               (size_type)in_stack_fffffffffffffb88);
    in_stack_fffffffffffffb88 = (BoxArray *)&stack0xfffffffffffffff4;
    std::
    make_unique<amrex::BndryRegister,amrex::BoxArray&,amrex::DistributionMapping&,int_const&,int_const&,int_const&,int_const&>
              (in_stack_fffffffffffffbd8,(DistributionMapping *)in_stack_fffffffffffffbd0,
               (int *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
               (int *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
               (int *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    Vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                 (size_type)in_stack_fffffffffffffb88);
    std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>::operator=
              ((unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_> *)
               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               (unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_> *)
               in_stack_fffffffffffffb88);
    std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>::~unique_ptr
              ((unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_> *)
               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    BoxArray::~BoxArray((BoxArray *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
  }
  for (local_b4 = 1; local_b4 < *(int *)((long)in_RDI + 0x34); local_b4 = local_b4 + 1) {
    Vector<int,_std::allocator<int>_>::operator[]
              ((Vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               (size_type)in_stack_fffffffffffffb88);
    Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                 (size_type)in_stack_fffffffffffffb88);
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               (size_type)in_stack_fffffffffffffb88);
    BoxArray::BoxArray((BoxArray *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                       in_stack_fffffffffffffb88);
    BoxArray::coarsen((BoxArray *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                      (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
    Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                 (size_type)in_stack_fffffffffffffb88);
    Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               (size_type)in_stack_fffffffffffffb88);
    in_stack_fffffffffffffb88 = (BoxArray *)&stack0xfffffffffffffff4;
    std::
    make_unique<amrex::BndryRegister,amrex::BoxArray&,amrex::DistributionMapping&,int_const&,int_const&,int_const&,int_const&>
              (in_stack_fffffffffffffbd8,(DistributionMapping *)in_stack_fffffffffffffbd0,
               (int *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
               (int *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
               (int *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    Vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                 (size_type)in_stack_fffffffffffffb88);
    std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>::operator=
              ((unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_> *)
               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               (unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_> *)
               in_stack_fffffffffffffb88);
    std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>::~unique_ptr
              ((unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_> *)
               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    Vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                 (size_type)in_stack_fffffffffffffb88);
    std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>::operator->
              ((unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_> *)
               0x12797ef);
    BndryRegister::setVal
              ((BndryRegister *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb98);
    BoxArray::~BoxArray((BoxArray *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
  }
  for (local_13c = 1; local_13c < *(int *)((long)in_RDI + 0x34); local_13c = local_13c + 1) {
    Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                 (size_type)in_stack_fffffffffffffb88);
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               (size_type)in_stack_fffffffffffffb88);
    Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                 (size_type)in_stack_fffffffffffffb88);
    Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               (size_type)in_stack_fffffffffffffb88);
    Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                 (size_type)in_stack_fffffffffffffb88);
    Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               (size_type)in_stack_fffffffffffffb88);
    std::
    make_unique<amrex::MLMGBndry,amrex::BoxArray&,amrex::DistributionMapping&,int_const&,amrex::Geometry&>
              ((BoxArray *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
               (DistributionMapping *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
               (Geometry *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
    Vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                 (size_type)in_stack_fffffffffffffb88);
    std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>::operator=
              ((unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_> *)
               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               (unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_> *)
               in_stack_fffffffffffffb88);
    std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>::~unique_ptr
              ((unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_> *)
               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                 (size_type)in_stack_fffffffffffffb88);
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               (size_type)in_stack_fffffffffffffb88);
    Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                 (size_type)in_stack_fffffffffffffb88);
    Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               (size_type)in_stack_fffffffffffffb88);
    local_2e8 = (element_type *)0x0;
    _Stack_2e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_2f8 = (element_type *)0x0;
    _Stack_2f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_2d8 = (pointer)0x0;
    MFInfo::MFInfo((MFInfo *)0x1279a15);
    local_300._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    val = &local_300;
    DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    MultiFab::MultiFab(in_stack_fffffffffffffbd0,
                       (BoxArray *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                       (DistributionMapping *)in_stack_fffffffffffffbc0,
                       (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
                       (int)in_stack_fffffffffffffbb8,
                       (MFInfo *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                       in_stack_fffffffffffffbe0);
    DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)0x1279a85);
    MFInfo::~MFInfo((MFInfo *)0x1279a92);
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),(value_type)val);
    Vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),(size_type)val);
    pMVar1 = std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>::operator->
                       ((unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_> *)
                        0x1279ac8);
    Vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),(size_type)val);
    pBVar2 = std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>::
             operator*((unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>
                        *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    BVar5 = local_c;
    piVar3 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)
                        CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),(size_type)val
                       );
    uVar4 = (undefined4)((ulong)val >> 0x20);
    in_stack_fffffffffffffb90 = *piVar3;
    this_00 = &local_318;
    BCRec::BCRec(this_00);
    in_stack_fffffffffffffb88 = (BoxArray *)CONCAT44(uVar4,BVar5);
    uVar4 = InterpBndryData::IBD_max_order_DEF;
    (*(pMVar1->super_InterpBndryData).super_BndryData.super_BndryRegister._vptr_BndryRegister[7])
              (pMVar1,pBVar2,0,local_2c8,0);
    local_33d[0]._vptr_FabFactory._1_4_ = 0x65;
    local_33d._5_4_ = 0x65;
    local_33d[1]._vptr_FabFactory._1_4_ = 0x65;
    in_stack_fffffffffffffbe0 = local_33d;
    std::allocator<std::array<amrex::LinOpBCType,_3UL>_>::allocator
              ((allocator<std::array<amrex::LinOpBCType,_3UL>_> *)0x1279bc7);
    Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ::vector((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
              *)CONCAT44(in_stack_fffffffffffffba4,uVar4),(size_type)this_00,
             (value_type *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
             (allocator_type *)in_stack_fffffffffffffb88);
    std::allocator<std::array<amrex::LinOpBCType,_3UL>_>::~allocator
              ((allocator<std::array<amrex::LinOpBCType,_3UL>_> *)0x1279bf5);
    Vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                 (size_type)in_stack_fffffffffffffb88);
    in_stack_fffffffffffffbc0 =
         std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>::operator->
                   ((unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_> *)
                    0x1279c19);
    piVar3 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)
                        CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                        (size_type)in_stack_fffffffffffffb88);
    in_stack_fffffffffffffbcc = *piVar3;
    in_stack_fffffffffffffbd0 = (MultiFab *)&stack0xfffffffffffffca8;
    RealVect::RealVect((RealVect *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    MLMGBndry::setLOBndryConds
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
               in_stack_fffffffffffffd5c,in_stack_fffffffffffffd50);
    Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ::~Vector((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
               *)0x1279c80);
    MultiFab::~MultiFab((MultiFab *)0x1279c8d);
  }
  std::
  vector<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
  ::resize((vector<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
            *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
           (size_type)in_stack_fffffffffffffba8);
  for (local_35c = 0; local_35c < *(int *)((long)in_RDI + 0x34); local_35c = local_35c + 1) {
    __args = (BoxArray *)
             Vector<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
             ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                           *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                          (size_type)in_stack_fffffffffffffb88);
    Vector<int,_std::allocator<int>_>::operator[]
              ((Vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               (size_type)in_stack_fffffffffffffb88);
    std::
    vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
    ::resize((vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
             (size_type)in_stack_fffffffffffffba8);
    local_360 = 0;
    while( true ) {
      in_stack_fffffffffffffbb4 = local_360;
      piVar3 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)
                          CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                          (size_type)in_stack_fffffffffffffb88);
      if (*piVar3 <= in_stack_fffffffffffffbb4) break;
      Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                   (size_type)in_stack_fffffffffffffb88);
      in_stack_fffffffffffffba8 =
           Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                     ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                      CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                      (size_type)in_stack_fffffffffffffb88);
      Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                   (size_type)in_stack_fffffffffffffb88);
      Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
                ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
                 CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                 (size_type)in_stack_fffffffffffffb88);
      std::
      make_unique<amrex::MLCellLinOp::BndryCondLoc,amrex::BoxArray&,amrex::DistributionMapping&,int_const&>
                (__args,(DistributionMapping *)
                        CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                 (int *)in_stack_fffffffffffffba8);
      Vector<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
      ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                   (size_type)in_stack_fffffffffffffb88);
      Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                   (size_type)in_stack_fffffffffffffb88);
      std::
      unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>
      ::operator=((unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>
                   *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                  (unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>
                   *)in_stack_fffffffffffffb88);
      std::
      unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>
      ::~unique_ptr((unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>
                     *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
      local_360 = local_360 + 1;
    }
  }
  return;
}

Assistant:

void
MLCellLinOp::defineBC ()
{
    BL_PROFILE("MLCellLinOp::defineBC()");

    const int ncomp = getNComp();

    m_bndry_sol.resize(m_num_amr_levels);
    m_crse_sol_br.resize(m_num_amr_levels);

    m_bndry_cor.resize(m_num_amr_levels);
    m_crse_cor_br.resize(m_num_amr_levels);

    m_robin_bcval.resize(m_num_amr_levels);

    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        m_bndry_sol[amrlev] = std::make_unique<MLMGBndry>(m_grids[amrlev][0], m_dmap[amrlev][0],
                                                          ncomp, m_geom[amrlev][0]);
    }

    for (int amrlev = 1; amrlev < m_num_amr_levels; ++amrlev)
    {
        const int in_rad = 0;
        const int out_rad = 1;
        const int extent_rad = 2;
        const int crse_ratio = m_amr_ref_ratio[amrlev-1];
        BoxArray cba = m_grids[amrlev][0];
        cba.coarsen(crse_ratio);
        m_crse_sol_br[amrlev] = std::make_unique<BndryRegister>
            (cba, m_dmap[amrlev][0], in_rad, out_rad, extent_rad, ncomp);
    }

    for (int amrlev = 1; amrlev < m_num_amr_levels; ++amrlev)
    {
        const int in_rad = 0;
        const int out_rad = 1;
        const int extent_rad = 2;
        const int crse_ratio = m_amr_ref_ratio[amrlev-1];
        BoxArray cba = m_grids[amrlev][0];
        cba.coarsen(crse_ratio);
        m_crse_cor_br[amrlev] = std::make_unique<BndryRegister>
            (cba, m_dmap[amrlev][0], in_rad, out_rad, extent_rad, ncomp);
        m_crse_cor_br[amrlev]->setVal(0.0);
    }

    // This has be to done after m_crse_cor_br is defined.
    for (int amrlev = 1; amrlev < m_num_amr_levels; ++amrlev)
    {
        m_bndry_cor[amrlev] = std::make_unique<MLMGBndry>(m_grids[amrlev][0], m_dmap[amrlev][0],
                                                          ncomp, m_geom[amrlev][0]);
        MultiFab bc_data(m_grids[amrlev][0], m_dmap[amrlev][0], ncomp, 1);
        bc_data.setVal(0.0);

        m_bndry_cor[amrlev]->setBndryValues(*m_crse_cor_br[amrlev], 0, bc_data, 0, 0, ncomp,
                                            m_amr_ref_ratio[amrlev-1], BCRec());

        Vector<Array<LinOpBCType,AMREX_SPACEDIM> > bclohi
            (ncomp,Array<LinOpBCType,AMREX_SPACEDIM>{{AMREX_D_DECL(BCType::Dirichlet,
                                                                   BCType::Dirichlet,
                                                                   BCType::Dirichlet)}});
        m_bndry_cor[amrlev]->setLOBndryConds(bclohi, bclohi, m_amr_ref_ratio[amrlev-1], RealVect{});
    }

    m_bcondloc.resize(m_num_amr_levels);
    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        m_bcondloc[amrlev].resize(m_num_mg_levels[amrlev]);
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev)
        {
            m_bcondloc[amrlev][mglev] = std::make_unique<BndryCondLoc>(m_grids[amrlev][mglev],
                                                                       m_dmap[amrlev][mglev],
                                                                       ncomp);
        }
    }
}